

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O0

int __thiscall CRETRCommand::doWhat(CRETRCommand *this,CClient *pClient)

{
  EFTPSTATE EVar1;
  int iVar2;
  char *pcVar3;
  FILE *pFVar4;
  long lVar5;
  undefined8 uVar6;
  CPasvDataTransfer *pCVar7;
  ostream *poVar8;
  CPortDataTransfer *this_00;
  allocator local_2299;
  undefined1 local_2298 [8];
  string ret_4;
  undefined1 local_2270 [8];
  string ret_3;
  CPortDataTransfer *c;
  undefined1 local_2240 [4];
  int port;
  string ip;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2200;
  string local_21e0;
  allocator local_21b9;
  undefined1 local_21b8 [8];
  string ret_2;
  char buffer_1 [4096];
  long len_1;
  FILE *file_1;
  int local_1168;
  allocator local_1161;
  int r_1;
  string msg_1;
  undefined1 local_1138 [8];
  string ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f0;
  string local_10d0;
  allocator local_10a9;
  undefined1 local_10a8 [8];
  string ret;
  char buffer [4096];
  long len;
  FILE *file;
  int local_58;
  int r;
  allocator local_41;
  undefined1 local_40 [8];
  string msg;
  CClient *pClient_local;
  CRETRCommand *this_local;
  
  msg.field_2._8_8_ = pClient;
  EVar1 = CClient::GetClientState(pClient);
  if (EVar1 == PASV) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_40,"SENDFILE#",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    CClient::GetUserDir_abi_cxx11_((string *)&file,(CClient *)msg.field_2._8_8_);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = chdir(pcVar3);
    std::__cxx11::string::~string((string *)&file);
    local_58 = iVar2;
    if (iVar2 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "Current user dir is error,now program will exit.");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pFVar4 = fopen(pcVar3,"rb");
    if (pFVar4 == (FILE *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_1138,"550 Failed to open file.\r\n",
                 (allocator *)(msg_1.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(msg_1.field_2._M_local_buf + 0xf));
      CClient::sendMsg((CClient *)msg.field_2._8_8_,(string *)local_1138);
      this_local._4_4_ = -1;
      ret_1.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_1138);
    }
    else {
      fseek(pFVar4,0,2);
      lVar5 = ftell(pFVar4);
      fclose(pFVar4);
      pcVar3 = ret.field_2._M_local_buf + 8;
      bzero(pcVar3,0x1000);
      uVar6 = std::__cxx11::string::c_str();
      sprintf(pcVar3,"150 Opening BINARY mode data connection for %s (%ld bytes).\r\n",uVar6,lVar5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_10a8,pcVar3,&local_10a9);
      std::allocator<char>::~allocator((allocator<char> *)&local_10a9);
      CClient::sendMsg((CClient *)msg.field_2._8_8_,(string *)local_10a8);
      CClient::GetUserDir_abi_cxx11_(&local_10d0,(CClient *)msg.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)local_40,(string *)&local_10d0);
      std::__cxx11::string::~string((string *)&local_10d0);
      std::operator+(&local_1110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     "#");
      std::operator+(&local_10f0,&local_1110,&(this->super_CCommand).m_Args);
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_10f0);
      std::__cxx11::string::~string((string *)&local_10f0);
      std::__cxx11::string::~string((string *)&local_1110);
      pCVar7 = CClient::GetClientPasvDataTransfer((CClient *)msg.field_2._8_8_);
      CPasvDataTransfer::SetMsg(pCVar7,(string *)local_40);
      pCVar7 = CClient::GetClientPasvDataTransfer((CClient *)msg.field_2._8_8_);
      iVar2 = CClient::GetClientfd((CClient *)msg.field_2._8_8_);
      CPasvDataTransfer::SetControlSock(pCVar7,iVar2);
      pCVar7 = CClient::GetClientPasvDataTransfer((CClient *)msg.field_2._8_8_);
      CPasvDataTransfer::PostSignal(pCVar7);
      CClient::SetClientState((CClient *)msg.field_2._8_8_,PASS);
      CClient::SetClientPasvDataTransfer((CClient *)msg.field_2._8_8_,(CPasvDataTransfer *)0x0);
      this_local._4_4_ = 1;
      ret_1.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_10a8);
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    EVar1 = CClient::GetClientState((CClient *)msg.field_2._8_8_);
    if (EVar1 == PORT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&r_1,"SENDFILE#",&local_1161);
      std::allocator<char>::~allocator((allocator<char> *)&local_1161);
      CClient::GetUserDir_abi_cxx11_((string *)&file_1,(CClient *)msg.field_2._8_8_);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar2 = chdir(pcVar3);
      std::__cxx11::string::~string((string *)&file_1);
      local_1168 = iVar2;
      if (iVar2 != 0) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "Current user dir is error,now program will exit.");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        exit(-1);
      }
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pFVar4 = fopen(pcVar3,"rb");
      if (pFVar4 == (FILE *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_2270,"550 Failed to open file.\r\n",
                   (allocator *)(ret_4.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(ret_4.field_2._M_local_buf + 0xf));
        CClient::sendMsg((CClient *)msg.field_2._8_8_,(string *)local_2270);
        this_local._4_4_ = -1;
        ret_1.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_2270);
      }
      else {
        fseek(pFVar4,0,2);
        lVar5 = ftell(pFVar4);
        fclose(pFVar4);
        pcVar3 = ret_2.field_2._M_local_buf + 8;
        bzero(pcVar3,0x1000);
        uVar6 = std::__cxx11::string::c_str();
        sprintf(pcVar3,"150 Opening BINARY mode data connection for %s (%ld bytes).\r\n",uVar6,lVar5
               );
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_21b8,pcVar3,&local_21b9);
        std::allocator<char>::~allocator((allocator<char> *)&local_21b9);
        CClient::sendMsg((CClient *)msg.field_2._8_8_,(string *)local_21b8);
        CClient::GetUserDir_abi_cxx11_(&local_21e0,(CClient *)msg.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)&r_1,(string *)&local_21e0);
        std::__cxx11::string::~string((string *)&local_21e0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&ip.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r_1,"#"
                      );
        std::operator+(&local_2200,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&ip.field_2 + 8),&(this->super_CCommand).m_Args);
        std::__cxx11::string::operator=((string *)&r_1,(string *)&local_2200);
        std::__cxx11::string::~string((string *)&local_2200);
        std::__cxx11::string::~string((string *)(ip.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)local_2240);
        iVar2 = CClient::GetClientPortIpAndPort((CClient *)msg.field_2._8_8_,(string *)local_2240);
        this_00 = (CPortDataTransfer *)operator_new(0x60);
        CPortDataTransfer::CPortDataTransfer(this_00,(string *)local_2240,iVar2);
        ret_3.field_2._8_8_ = this_00;
        CPortDataTransfer::SetMsg(this_00,(string *)&r_1);
        uVar6 = ret_3.field_2._8_8_;
        iVar2 = CClient::GetClientfd((CClient *)msg.field_2._8_8_);
        CPortDataTransfer::SetControlSock((CPortDataTransfer *)uVar6,iVar2);
        CThread::Run((CThread *)ret_3.field_2._8_8_);
        CClient::SetClientState((CClient *)msg.field_2._8_8_,PASS);
        this_local._4_4_ = 1;
        ret_1.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_2240);
        std::__cxx11::string::~string((string *)local_21b8);
      }
      std::__cxx11::string::~string((string *)&r_1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_2298,"425 Use PORT or PASV first.\r\n",&local_2299);
      std::allocator<char>::~allocator((allocator<char> *)&local_2299);
      CClient::sendMsg((CClient *)msg.field_2._8_8_,(string *)local_2298);
      this_local._4_4_ = -1;
      ret_1.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_2298);
    }
  }
  return this_local._4_4_;
}

Assistant:

int CRETRCommand::doWhat(CClient *pClient){
    if(pClient->GetClientState() == PASV){
        string msg = "SENDFILE#";
        int r = chdir(pClient->GetUserDir().c_str());
        if(r == 0){
            FILE *file = fopen(m_Args.c_str(),"rb");
            if(file != NULL){
                fseek(file,0,2);
                long len = ftell(file);
                fclose(file);
                char buffer[BUFFER_SIZE];
                bzero(buffer,BUFFER_SIZE);
                sprintf(buffer,"150 Opening BINARY mode data connection for %s (%ld bytes).\r\n",
                        m_Args.c_str(),len);

                string ret(buffer);
                pClient->sendMsg(ret);

                msg += pClient->GetUserDir();
                msg = msg + "#" + m_Args;
                pClient->GetClientPasvDataTransfer()->SetMsg(msg);
                pClient->GetClientPasvDataTransfer()->SetControlSock(pClient->GetClientfd());
                pClient->GetClientPasvDataTransfer()->PostSignal();

                pClient->SetClientState(PASS);
                pClient->SetClientPasvDataTransfer(NULL);
                return 1;
            }
            else{
                string ret = "550 Failed to open file.\r\n";
                pClient->sendMsg(ret);
                return -1;
            }
        }
        else{
            cout << "Current user dir is error,now program will exit." << endl;
            exit(-1);
        }
    }
    else if(pClient->GetClientState() == PORT){
        string msg = "SENDFILE#";
        int r = chdir(pClient->GetUserDir().c_str());
        if(r == 0){
            FILE *file = fopen(m_Args.c_str(),"rb");
            if(file != NULL){
                fseek(file,0,2);
                long len = ftell(file);
                fclose(file);
                char buffer[BUFFER_SIZE];
                bzero(buffer,BUFFER_SIZE);
                sprintf(buffer,"150 Opening BINARY mode data connection for %s (%ld bytes).\r\n",
                        m_Args.c_str(),len);

                string ret(buffer);
                pClient->sendMsg(ret);

                msg += pClient->GetUserDir();
                msg = msg + "#" + m_Args;
                string ip;
                int port;

                port = pClient->GetClientPortIpAndPort(ip);

                CPortDataTransfer *c = new CPortDataTransfer(ip,port);
                c->SetMsg(msg);
                c->SetControlSock(pClient->GetClientfd());
                c->Run();

                pClient->SetClientState(PASS);
                return 1;
            }
            else{
                string ret = "550 Failed to open file.\r\n";
                pClient->sendMsg(ret);
                return -1;
            }
        }
        else{
            cout << "Current user dir is error,now program will exit." << endl;
            exit(-1);
        }
    }
    else{
        string ret = "425 Use PORT or PASV first.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}